

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O3

compile_errcode __thiscall FunctionCall::Parse(FunctionCall *this)

{
  LogTools *log_tools_ptr;
  SymbolName SVar1;
  compile_errcode cVar2;
  compile_errcode cVar3;
  undefined4 uVar4;
  string local_48;
  
  cVar3 = 0;
  uVar4 = 0;
LAB_0012d267:
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    switch(uVar4) {
    case 0:
      uVar4 = 1;
      if (SVar1 != IDENTIFIER_SYM) goto LAB_0012d302;
      break;
    case 1:
      uVar4 = 2;
      if (SVar1 != L_CIRCLE_BRACKET_SYM) goto LAB_0012d302;
      break;
    case 2:
      goto switchD_0012d27d_caseD_2;
    case 3:
      uVar4 = 4;
      if (SVar1 != R_CIRCLE_BRACKET_SYM) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"expected a \')\' in function call","");
        GrammaErrorLogs(log_tools_ptr,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        goto LAB_0012d302;
      }
      break;
    case 4:
      goto switchD_0012d27d_caseD_4;
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
  } while( true );
switchD_0012d27d_caseD_2:
  cVar2 = ValueArgumentList::Parse(&this->m_value_argument_list);
  uVar4 = 3;
  if (cVar2 != 0) {
LAB_0012d302:
    cVar3 = -1;
switchD_0012d27d_caseD_4:
    return cVar3;
  }
  goto LAB_0012d267;
}

Assistant:

compile_errcode FunctionCall::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == IDENTIFIER_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if ((ret = m_value_argument_list.Parse()) == COMPILE_OK) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')' in function call");
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        if (state != 3)
            handle_symbol_queue->NextSymbol();
    }
}